

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

type __thiscall
nonstd::optional_lite::optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
operator=(optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *this,
         optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *other)

{
  bool bVar1;
  value_type *pvVar2;
  value_type *this_00;
  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *other_local;
  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *this_local;
  
  bVar1 = has_value(this);
  if ((!bVar1) || (bVar1 = has_value(other), bVar1)) {
    bVar1 = has_value(this);
    if ((bVar1) || (bVar1 = has_value(other), !bVar1)) {
      bVar1 = has_value(this);
      if ((bVar1) && (bVar1 = has_value(other), bVar1)) {
        pvVar2 = operator*(other);
        this_00 = detail::storage_t<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                  ::value((storage_t<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                           *)&this->contained);
        tinyusdz::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)this_00,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
      }
    }
    else {
      pvVar2 = operator*(other);
      optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::
      initialize<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                ((optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>> *)this,
                 pvVar2);
    }
  }
  else {
    reset(this);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }